

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamWriter::writeAttribute(QXmlStreamWriter *this,QXmlStreamAttribute *attribute)

{
  long lVar1;
  QStringView v;
  QStringView v_00;
  QStringView v_01;
  QStringView v_02;
  bool bVar2;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  QStringView QVar3;
  QAnyStringView in_stack_00000000;
  QAnyStringView in_stack_00000010;
  undefined1 in_stack_000000a0 [16];
  undefined1 in_stack_000000b0 [16];
  undefined1 in_stack_000000d0 [16];
  QAnyStringView *in_stack_ffffffffffffff28;
  storage_type_conflict *in_stack_ffffffffffffff38;
  QXmlStreamWriter *this_00;
  QXmlStreamWriter *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamAttribute::namespaceUri((QXmlStreamAttribute *)0x64ea3a);
  bVar2 = QStringView::isEmpty((QStringView *)0x64ea57);
  if (bVar2) {
    QVar3 = QXmlStreamAttribute::qualifiedName((QXmlStreamAttribute *)0x64ea6a);
    this_00 = (QXmlStreamWriter *)QVar3.m_size;
    QVar3.m_data = in_stack_ffffffffffffff38;
    QVar3.m_size = in_RDI;
    QAnyStringView::QAnyStringView(in_stack_ffffffffffffff28,QVar3);
    QXmlStreamAttribute::value((QXmlStreamAttribute *)0x64ea95);
    v.m_data = in_stack_ffffffffffffff38;
    v.m_size = in_RDI;
    QAnyStringView::QAnyStringView(in_stack_ffffffffffffff28,v);
    writeAttribute(this_00,in_stack_00000010,in_stack_00000000);
  }
  else {
    QXmlStreamAttribute::namespaceUri((QXmlStreamAttribute *)0x64eaef);
    v_00.m_data = in_stack_ffffffffffffff38;
    v_00.m_size = in_RDI;
    QAnyStringView::QAnyStringView(in_stack_ffffffffffffff28,v_00);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x64eb1a);
    v_01.m_data = in_stack_ffffffffffffff38;
    v_01.m_size = in_RDI;
    QAnyStringView::QAnyStringView(in_stack_ffffffffffffff28,v_01);
    QVar3 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x64eb45);
    v_02.m_data = (storage_type_conflict *)QVar3.m_size;
    v_02.m_size = in_RDI;
    QAnyStringView::QAnyStringView(in_stack_ffffffffffffff28,v_02);
    writeAttribute(in_stack_ffffffffffffffc8,(QAnyStringView)in_stack_000000b0,
                   (QAnyStringView)in_stack_000000a0,(QAnyStringView)in_stack_000000d0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriter::writeAttribute(const QXmlStreamAttribute& attribute)
{
    if (attribute.namespaceUri().isEmpty())
        writeAttribute(attribute.qualifiedName(), attribute.value());
    else
        writeAttribute(attribute.namespaceUri(), attribute.name(), attribute.value());
}